

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

NodeTraversalSignal
prvTidyTraverseNodeTree(TidyDocImpl *doc,Node *node,NodeTraversalCallBack *cb,void *propagate)

{
  NodeTraversalSignal local_34;
  NodeTraversalSignal s;
  void *propagate_local;
  NodeTraversalCallBack *cb_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  cb_local = (NodeTraversalCallBack *)node;
  while( true ) {
    if (cb_local == (NodeTraversalCallBack *)0x0) {
      return ContinueTraversal;
    }
    local_34 = (*cb)(doc,(Node *)cb_local,propagate);
    if ((*(long *)(cb_local + 0x18) != 0) &&
       ((local_34 == ContinueTraversal || (local_34 == SkipSiblings)))) {
      local_34 = prvTidyTraverseNodeTree(doc,*(Node **)(cb_local + 0x18),cb,propagate);
    }
    if (local_34 - SkipSiblings < 2) break;
    if (local_34 == VisitParent) {
      cb_local = *(NodeTraversalCallBack **)cb_local;
    }
    else {
      if (local_34 == ExitTraversal) {
        return ExitTraversal;
      }
      cb_local = *(NodeTraversalCallBack **)(cb_local + 0x10);
    }
  }
  return ContinueTraversal;
}

Assistant:

NodeTraversalSignal TY_(TraverseNodeTree)(TidyDocImpl* doc, Node* node, NodeTraversalCallBack *cb, void *propagate )
{
    while (node)
    {
        NodeTraversalSignal s = (*cb)(doc, node, propagate);

        if (node->content && (s == ContinueTraversal || s == SkipSiblings))
        {
            s = TY_(TraverseNodeTree)(doc, node->content, cb, propagate);
        }

        switch (s)
        {
        case ExitTraversal:
            return ExitTraversal;

        case VisitParent:
            node = node->parent;
            continue;

        case SkipSiblings:
        case SkipChildrenAndSiblings:
            return ContinueTraversal;

        default:
            node = node->next;
            break;
        }
    }
    return ContinueTraversal;
}